

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O2

void __thiscall OpenMD::NPrT::NPrT(NPrT *this,SimInfo *info)

{
  Globals *pGVar1;
  bool bVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPrT_002be158;
  SquareMatrix<double,_3>::SquareMatrix(&(this->eta).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->oldEta_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->prevEta_).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->vScale_).super_SquareMatrix<double,_3>);
  pGVar1 = ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->simParams_;
  if ((pGVar1->SurfaceTension).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg + 0x30,"arostat.\n",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ou must set tauB",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"PT integrator, y",0x10);
    builtin_strncpy(painCave.errMsg,"If you use the N",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->surfaceTension_ = (pGVar1->SurfaceTension).data_ * 1.439326479 * 0.0004184;
    pbVar4 = &(pGVar1->PrivilegedAxis).data_;
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar4);
    bVar2 = std::operator==(&local_40,"x");
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) {
      this->axis_ = 0;
      uVar3 = 0;
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)pbVar4);
      bVar2 = std::operator==(&local_40,"y");
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar2) {
        this->axis_ = 1;
        uVar3 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_40,(string *)pbVar4);
        bVar2 = std::operator==(&local_40,"z");
        std::__cxx11::string::~string((string *)&local_40);
        if (bVar2) {
          this->axis_ = 2;
          uVar3 = 2;
        }
        else {
          uVar3 = this->axis_;
        }
      }
    }
    this->axis1_ = (uVar3 + 1) % 3;
    this->axis2_ = (uVar3 + 2) % 3;
  }
  return;
}

Assistant:

NPrT::NPrT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();
    if (!simParams->haveSurfaceTension()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      surfaceTension_ = simParams->getSurfaceTension() *
                        Constants::surfaceTensionConvert *
                        Constants::energyConvert;

      // Default value of privilegedAxis is "z"
      if (simParams->getPrivilegedAxis() == "x")
        axis_ = 0;
      else if (simParams->getPrivilegedAxis() == "y")
        axis_ = 1;
      else if (simParams->getPrivilegedAxis() == "z")
        axis_ = 2;

      // Compute complementary axes to the privileged axis
      axis1_ = (axis_ + 1) % 3;
      axis2_ = (axis_ + 2) % 3;
    }
  }